

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_4dPoint * __thiscall ON_4dPoint::operator/=(ON_4dPoint *this,double d)

{
  double dVar1;
  
  dVar1 = 1.0 / d;
  this->x = this->x * dVar1;
  this->y = this->y * dVar1;
  this->z = this->z * dVar1;
  this->w = dVar1 * this->w;
  return this;
}

Assistant:

ON_4dPoint& ON_4dPoint::operator/=(double d)
{
  const double one_over_d = 1.0/d;
  x *= one_over_d;
  y *= one_over_d;
  z *= one_over_d;
  w *= one_over_d;
  return *this;
}